

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

void __thiscall
duckdb::CSVReaderOptions::ToNamedParameters
          (CSVReaderOptions *this,named_parameter_map_t *named_params)

{
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *this_00;
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var5;
  mapped_type *pmVar6;
  long value;
  mapped_type *pmVar7;
  const_iterator cVar8;
  pointer pbVar9;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  bool bVar10;
  vector<duckdb::Value,_true> content;
  Value local_250;
  Value local_210;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1d0;
  pointer local_1c8;
  pointer pVStack_1c0;
  pointer local_1b8;
  CSVReaderOptions *local_1b0;
  key_type local_1a8;
  key_type local_188;
  key_type local_168;
  string local_148;
  vector<duckdb::Value,_true> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->dialect_options).state_machine_options.delimiter.set_by_user == true) {
    pcVar1 = (this->dialect_options).state_machine_options.delimiter.value._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,
               pcVar1 + (this->dialect_options).state_machine_options.delimiter.value.
                        _M_string_length);
    Value::Value(&local_210,&local_70);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"delim","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if ((this->dialect_options).state_machine_options.new_line.set_by_user == true) {
    GetNewline_abi_cxx11_(&local_50,this);
    Value::Value(&local_210,&local_50);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"new_line","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((this->dialect_options).state_machine_options.quote.set_by_user == true) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    Value::Value(&local_210,&local_90);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"quote","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if ((this->dialect_options).state_machine_options.escape.set_by_user == true) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_b0,'\x01');
    Value::Value(&local_210,&local_b0);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"escape","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((this->dialect_options).state_machine_options.comment.set_by_user == true) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_d0,'\x01');
    Value::Value(&local_210,&local_d0);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"comment","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if ((this->dialect_options).header.set_by_user == true) {
    Value::Value(&local_210,(this->dialect_options).header.value);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"header","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
  }
  if ((this->dialect_options).state_machine_options.strict_mode.set_by_user == true) {
    Value::Value(&local_210,(this->dialect_options).state_machine_options.strict_mode.value);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"strict_mode","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
  }
  value = NumericCastImpl<long,_unsigned_long,_false>::Convert((this->maximum_line_size).value);
  Value::BIGINT(&local_210,value);
  pp_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10);
  local_250.type_._0_8_ = pp_Var5;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"max_line_size","");
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_250);
  Value::operator=(pmVar6,&local_210);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ != pp_Var5) {
    operator_delete((void *)local_250.type_._0_8_);
  }
  Value::~Value(&local_210);
  if ((this->dialect_options).skip_rows.set_by_user == true) {
    Value::UBIGINT(&local_210,(this->dialect_options).skip_rows.value);
    local_250.type_._0_8_ = pp_Var5;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"skip","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ != pp_Var5) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
  }
  Value::BOOLEAN(&local_210,this->null_padding);
  local_250.type_._0_8_ = pp_Var5;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"null_padding","");
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_250);
  Value::operator=(pmVar6,&local_210);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ != pp_Var5) {
    operator_delete((void *)local_250.type_._0_8_);
  }
  Value::~Value(&local_210);
  Value::BOOLEAN(&local_210,this->parallel);
  local_250.type_._0_8_ = pp_Var5;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"parallel","");
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_250);
  Value::operator=(pmVar6,&local_210);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ != pp_Var5) {
    operator_delete((void *)local_250.type_._0_8_);
  }
  Value::~Value(&local_210);
  this_00 = &(this->dialect_options).date_format;
  pmVar7 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::at(this_00,&LogicalType::DATE);
  if ((pmVar7->value).super_StrTimeFormat.format_specifier._M_string_length != 0) {
    pmVar7 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::at(this_00,&LogicalType::DATE);
    pcVar1 = (pmVar7->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,
               pcVar1 + (pmVar7->value).super_StrTimeFormat.format_specifier._M_string_length);
    Value::Value(&local_210,&local_f0);
    local_250.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"dateformat","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  pmVar7 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::at(this_00,&LogicalType::TIMESTAMP);
  if ((pmVar7->value).super_StrTimeFormat.format_specifier._M_string_length != 0) {
    pmVar7 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::at(this_00,&LogicalType::TIMESTAMP);
    pcVar1 = (pmVar7->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,
               pcVar1 + (pmVar7->value).super_StrTimeFormat.format_specifier._M_string_length);
    Value::Value(&local_210,&local_110);
    local_250.type_._0_8_ = (long)&local_250 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"timestampformat","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_250);
    Value::operator=(pmVar6,&local_210);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
      operator_delete((void *)local_250.type_._0_8_);
    }
    Value::~Value(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  Value::BOOLEAN(&local_210,this->normalize_names);
  local_250.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"normalize_names","");
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_250);
  Value::operator=(pmVar6,&local_210);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
    operator_delete((void *)local_250.type_._0_8_);
  }
  Value::~Value(&local_210);
  pbVar9 = (this->name_list).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->name_list).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1d0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)named_params;
  if (pbVar9 == pbVar2) {
LAB_0154c0bf:
    bVar4 = false;
  }
  else {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"columns","");
    cVar8 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&named_params->_M_h,&local_168);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) goto LAB_0154c0bf;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"column_names","");
    cVar8 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&named_params->_M_h,&local_188);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"names","");
      cVar8 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&named_params->_M_h,&local_1a8);
      bVar10 = cVar8.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
               ._M_cur == (__node_type *)0x0;
      bVar4 = true;
      bVar3 = true;
      goto LAB_0154c0c8;
    }
    bVar4 = true;
  }
  bVar3 = false;
  bVar10 = false;
LAB_0154c0c8:
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2)) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  this_01 = local_1d0;
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2)) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((pbVar9 != pbVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2)) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if (bVar10) {
    local_1c8 = (pointer)0x0;
    pVStack_1c0 = (pointer)0x0;
    local_1b8 = (pointer)0x0;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8,
               (long)(this->name_list).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->name_list).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    pbVar9 = (this->name_list).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->name_list).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1b0 = this;
    if (pbVar9 != pbVar2) {
      do {
        pcVar1 = (pbVar9->_M_dataplus)._M_p;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar1,pcVar1 + pbVar9->_M_string_length);
        Value::Value(&local_210,&local_148);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8,&local_210);
        Value::~Value(&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar2);
    }
    LogicalType::LogicalType(&local_210.type_,VARCHAR);
    local_128.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = local_1c8;
    local_128.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVStack_1c0;
    local_128.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_1b8;
    local_1c8 = (pointer)0x0;
    pVStack_1c0 = (pointer)0x0;
    local_1b8 = (pointer)0x0;
    Value::LIST(&local_250,&local_210.type_,&local_128);
    this_01 = local_1d0;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_128);
    LogicalType::~LogicalType(&local_210.type_);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8);
    local_210.type_._0_8_ =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_210 + 0x10U);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"column_names","");
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](this_01,(key_type *)&local_210);
    this = local_1b0;
    Value::operator=(pmVar6,&local_250);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_210.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_210 + 0x10U)) {
      operator_delete((void *)local_210.type_._0_8_);
    }
    Value::~Value(&local_250);
  }
  Value::BOOLEAN(&local_210,this->all_varchar);
  local_250.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"all_varchar","");
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](this_01,(key_type *)&local_250);
  Value::operator=(pmVar6,&local_210);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_250 + 0x10U)) {
    operator_delete((void *)local_250.type_._0_8_);
  }
  Value::~Value(&local_210);
  return;
}

Assistant:

void CSVReaderOptions::ToNamedParameters(named_parameter_map_t &named_params) const {
	auto &delimiter = dialect_options.state_machine_options.delimiter;
	auto &quote = dialect_options.state_machine_options.quote;
	auto &escape = dialect_options.state_machine_options.escape;
	auto &comment = dialect_options.state_machine_options.comment;
	auto &strict_mode = dialect_options.state_machine_options.strict_mode;
	auto &header = dialect_options.header;
	if (delimiter.IsSetByUser()) {
		named_params["delim"] = Value(GetDelimiter());
	}
	if (dialect_options.state_machine_options.new_line.IsSetByUser()) {
		named_params["new_line"] = Value(GetNewline());
	}
	if (quote.IsSetByUser()) {
		named_params["quote"] = Value(GetQuote());
	}
	if (escape.IsSetByUser()) {
		named_params["escape"] = Value(GetEscape());
	}
	if (comment.IsSetByUser()) {
		named_params["comment"] = Value(GetComment());
	}
	if (header.IsSetByUser()) {
		named_params["header"] = Value(GetHeader());
	}
	if (strict_mode.IsSetByUser()) {
		named_params["strict_mode"] = Value(GetRFC4180());
	}
	named_params["max_line_size"] = Value::BIGINT(NumericCast<int64_t>(maximum_line_size.GetValue()));
	if (dialect_options.skip_rows.IsSetByUser()) {
		named_params["skip"] = Value::UBIGINT(GetSkipRows());
	}
	named_params["null_padding"] = Value::BOOLEAN(null_padding);
	named_params["parallel"] = Value::BOOLEAN(parallel);
	if (!dialect_options.date_format.at(LogicalType::DATE).GetValue().format_specifier.empty()) {
		named_params["dateformat"] =
		    Value(dialect_options.date_format.at(LogicalType::DATE).GetValue().format_specifier);
	}
	if (!dialect_options.date_format.at(LogicalType::TIMESTAMP).GetValue().format_specifier.empty()) {
		named_params["timestampformat"] =
		    Value(dialect_options.date_format.at(LogicalType::TIMESTAMP).GetValue().format_specifier);
	}

	named_params["normalize_names"] = Value::BOOLEAN(normalize_names);
	if (!name_list.empty() && !named_params.count("columns") && !named_params.count("column_names") &&
	    !named_params.count("names")) {
		named_params["column_names"] = StringVectorToValue(name_list);
	}
	named_params["all_varchar"] = Value::BOOLEAN(all_varchar);
}